

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::warning<char_const(&)[85],char_const*&,char_const*&>
          (Reporter *this,char (*args) [85],char **args_1,char **args_2)

{
  format_string<const_char_*&,_const_char_*&> fmt;
  size_t sVar1;
  ostream *os;
  char **in_RDX;
  char **in_RSI;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  basic_string_view<char> in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  
  sVar1 = std::char_traits<char>::length((char_type *)0x2343c5);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff50,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff48);
  os = (ostream *)std::char_traits<char>::length((char_type *)0x23445a);
  fmt.str_.size_ = in_stack_ffffffffffffff90;
  fmt.str_.data_ = in_stack_ffffffffffffff88;
  ::fmt::v10::print<char_const*&,char_const*&>(in_RDI,fmt,in_RSI,in_RDX);
  std::char_traits<char>::length((char_type *)0x2344eb);
  ::fmt::v10::print<>(os,(format_string<>)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }